

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int i2cZip(uint handle,char *inBuf,uint inLen,char *outBuf,uint outLen)

{
  uint uVar1;
  FILE *pFVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  byte bVar10;
  uint numSegs;
  ulong local_310;
  ulong local_308;
  pi_i2c_msg_t segs [42];
  
  pFVar2 = _stderr;
  uVar6 = (ulong)handle;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(inLen,inBuf);
    fprintf(pFVar2,"%s %s: handle=%d inBuf=%s outBuf=%08X len=%d\n",myTimeStamp::buf,"i2cZip",uVar6,
            myBuf2Str::str,outBuf,(ulong)outLen);
  }
  if (libInitialised == '\0') {
    iVar3 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cZip_cold_1();
    }
  }
  else if (handle < 0x40) {
    if (i2cInfo[uVar6].state == 2) {
      if (inBuf == (char *)0x0 || inLen == 0) {
        iVar3 = -0x5a;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cZip_cold_3();
        }
      }
      else {
        if (outLen == 0 || outBuf != (char *)0x0) {
          local_308 = (ulong)i2cInfo[uVar6].addr;
          local_310 = 0;
          uVar1 = 0;
          numSegs = 0;
          uVar7 = 0;
          bVar9 = 0;
          do {
            pFVar2 = _stderr;
            lVar5 = (long)(int)uVar7;
            if ((4 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
              myTimeStamp();
              fprintf(pFVar2,"%s %s: status=%d inpos=%d inlen=%d cmd=%d addr=%d flags=%x\n",
                      myTimeStamp::buf,"i2cZip",0,(ulong)uVar7,(ulong)inLen,
                      (ulong)(uint)(int)inBuf[lVar5],local_308,local_310);
            }
            bVar10 = inBuf[lVar5];
            if (7 < bVar10) {
              return -0x6f;
            }
            uVar6 = lVar5 + 1;
            switch(bVar10) {
            case 0:
              uVar4 = 1;
LAB_00112e9a:
              if (numSegs != 0 && -1 < (int)uVar4) {
                uVar4 = i2cSegments(handle,segs,numSegs);
              }
              if (-1 < (int)uVar4) {
                return uVar1;
              }
              return uVar4;
            case 1:
              uVar4 = 0;
              break;
            case 2:
              uVar4 = 0;
              if (numSegs != 0) {
                uVar4 = i2cSegments(handle,segs,numSegs);
                uVar4 = (int)uVar4 >> 0x1f & uVar4;
              }
              iVar3 = 1;
              goto LAB_00112bc8;
            case 3:
              uVar4 = 0;
              if (numSegs != 0) {
                uVar4 = i2cSegments(handle,segs,numSegs);
                uVar4 = (int)uVar4 >> 0x1f & uVar4;
              }
              iVar3 = 0;
LAB_00112bc8:
              numSegs = 0;
              i2cSwitchCombined(iVar3);
              bVar10 = 0;
              break;
            case 4:
              if ((int)((bVar9 == 0 | 0xfffffffe) + inLen) <= (int)uVar7) {
                return -0x6f;
              }
              uVar4 = (uint)inBuf[uVar6];
              if (bVar9 == 0) {
                uVar7 = uVar7 + 2;
              }
              else {
                uVar7 = uVar7 + 3;
                uVar4 = inBuf[lVar5 + 2] * 0x100 + uVar4;
              }
              uVar6 = (ulong)uVar7;
              local_308 = (ulong)uVar4;
              uVar4 = (int)uVar4 >> 0x1f & 0xffffff91;
              bVar10 = 0;
              break;
            case 5:
              if ((int)(inLen - 2) <= (int)uVar7) {
                return -0x6f;
              }
              uVar4 = inBuf[lVar5 + 2] * 0x100 + (int)inBuf[uVar6];
              local_310 = (ulong)uVar4;
              uVar4 = (int)uVar4 >> 0x1f & 0xffffff91;
              bVar10 = 0;
              uVar6 = (ulong)(uVar7 + 3);
              break;
            case 6:
              if ((int)((bVar9 == 0 | 0xfffffffe) + inLen) <= (int)uVar7) {
                return -0x6e;
              }
              iVar3 = (int)inBuf[uVar6];
              if (bVar9 == 0) {
                uVar7 = uVar7 + 2;
              }
              else {
                uVar7 = uVar7 + 3;
                iVar3 = inBuf[lVar5 + 2] * 0x100 + iVar3;
              }
              uVar6 = (ulong)uVar7;
              if (iVar3 < 0) {
                return -0x6e;
              }
              uVar7 = iVar3 + uVar1;
              if (outLen <= uVar7) {
                return -0x6e;
              }
              segs[(int)numSegs].addr = (uint16_t)local_308;
              segs[(int)numSegs].flags = (ushort)local_310 | 1;
              segs[(int)numSegs].len = (uint16_t)iVar3;
              segs[(int)numSegs].buf = (uint8_t *)(outBuf + uVar1);
              if ((int)numSegs < 0x29) {
                uVar4 = 0;
                numSegs = numSegs + 1;
              }
              else {
                uVar4 = i2cSegments(handle,segs,numSegs + 1);
                uVar4 = (int)uVar4 >> 0x1f & uVar4;
                numSegs = 0;
              }
              goto LAB_00112da6;
            case 7:
              if ((int)((bVar9 == 0 | 0xfffffffe) + inLen) <= (int)uVar7) {
                return -0x6d;
              }
              iVar3 = (int)inBuf[uVar6];
              if (bVar9 == 0) {
                iVar8 = uVar7 + 2;
              }
              else {
                iVar8 = uVar7 + 3;
                iVar3 = inBuf[lVar5 + 2] * 0x100 + iVar3;
              }
              if (iVar3 < 0) {
                return -0x6d;
              }
              uVar6 = (ulong)(uint)(iVar3 + iVar8);
              if (inLen <= (uint)(iVar3 + iVar8)) {
                return -0x6d;
              }
              segs[(int)numSegs].addr = (uint16_t)local_308;
              segs[(int)numSegs].flags = (ushort)local_310 & 0xfffe;
              segs[(int)numSegs].len = (uint16_t)iVar3;
              segs[(int)numSegs].buf = (uint8_t *)(inBuf + iVar8);
              uVar7 = uVar1;
              if ((int)numSegs < 0x29) {
                uVar4 = 0;
                numSegs = numSegs + 1;
              }
              else {
                uVar4 = i2cSegments(handle,segs,numSegs + 1);
                uVar4 = (int)uVar4 >> 0x1f & uVar4;
                numSegs = 0;
              }
LAB_00112da6:
              bVar10 = 0;
              uVar1 = uVar7;
            }
            if ((uVar4 != 0) || (uVar7 = (uint)uVar6, bVar9 = bVar10, inLen <= uVar7))
            goto LAB_00112e9a;
          } while( true );
        }
        iVar3 = -0x5a;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cZip_cold_4();
        }
      }
    }
    else {
      iVar3 = -0x19;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        i2cZip_cold_2();
      }
    }
  }
  else {
    iVar3 = -0x19;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cZip_cold_5();
    }
  }
  return iVar3;
}

Assistant:

int i2cZip(
   unsigned handle,
   char *inBuf, unsigned inLen, char *outBuf, unsigned outLen)
{
   int numSegs, inPos, outPos, status, bytes, flags, addr;
   int esc, setesc;
   pi_i2c_msg_t segs[PI_I2C_RDRW_IOCTL_MAX_MSGS];

   DBG(DBG_USER, "handle=%d inBuf=%s outBuf=%08X len=%d",
      handle, myBuf2Str(inLen, (char *)inBuf), (int)outBuf, outLen);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (!inBuf || !inLen)
      SOFT_ERROR(PI_BAD_POINTER, "input buffer can't be NULL");

   if (!outBuf && outLen)
      SOFT_ERROR(PI_BAD_POINTER, "output buffer can't be NULL");

   numSegs = 0;

   inPos = 0;
   outPos = 0;
   status = 0;

   addr = i2cInfo[handle].addr;
   flags = 0;
   esc = 0;
   setesc = 0;

   while (!status && (inPos < inLen))
   {
      DBG(DBG_INTERNAL, "status=%d inpos=%d inlen=%d cmd=%d addr=%d flags=%x",
         status, inPos, inLen, inBuf[inPos], addr, flags);

      switch (inBuf[inPos++])
      {
         case PI_I2C_END:
            status = 1;
            break;

         case PI_I2C_COMBINED_ON:
            /* Run prior transactions before setting combined flag */
            if (numSegs)
            {
               status = i2cSegments(handle, segs, numSegs);
               if (status >= 0) status = 0; /* continue */
               numSegs = 0;
            }
            i2cSwitchCombined(1);
            break;

         case PI_I2C_COMBINED_OFF:
            /* Run prior transactions before clearing combined flag */
            if (numSegs)
            {
               status = i2cSegments(handle, segs, numSegs);
               if (status >= 0) status = 0; /* continue */
               numSegs = 0;
            }
            i2cSwitchCombined(0);
            break;

         case PI_I2C_ADDR:
            addr = myI2CGetPar(inBuf, &inPos, inLen, &esc);
            if (addr < 0) status = PI_BAD_I2C_CMD;
            break;

         case PI_I2C_FLAGS:
            /* cheat to force two byte flags */
            esc = 1;
            flags = myI2CGetPar(inBuf, &inPos, inLen, &esc);
            if (flags < 0) status = PI_BAD_I2C_CMD;
            break;

         case PI_I2C_ESC:
            setesc = 1;
            break;

         case PI_I2C_READ:

            bytes = myI2CGetPar(inBuf, &inPos, inLen, &esc);

            if (bytes >= 0)
            {
               if ((bytes + outPos) < outLen)
               {
                  segs[numSegs].addr = addr;
                  segs[numSegs].flags = (flags|1);
                  segs[numSegs].len = bytes;
                  segs[numSegs].buf = (uint8_t *)(outBuf + outPos);
                  outPos += bytes;
                  numSegs++;
                  if (numSegs >= PI_I2C_RDRW_IOCTL_MAX_MSGS)
                  {
                     status = i2cSegments(handle, segs, numSegs);
                     if (status >= 0) status = 0; /* continue */
                     numSegs = 0;
                  }
               }
               else status = PI_BAD_I2C_RLEN;
            }
            else status = PI_BAD_I2C_RLEN;
            break;

         case PI_I2C_WRITE:

            bytes = myI2CGetPar(inBuf, &inPos, inLen, &esc);

            if (bytes >= 0)
            {
               if ((bytes + inPos) < inLen)
               {
                  segs[numSegs].addr = addr;
                  segs[numSegs].flags = (flags&0xfffe);
                  segs[numSegs].len = bytes;
                  segs[numSegs].buf = (uint8_t *)(inBuf + inPos);
                  inPos += bytes;
                  numSegs++;
                  if (numSegs >= PI_I2C_RDRW_IOCTL_MAX_MSGS)
                  {
                     status = i2cSegments(handle, segs, numSegs);
                     if (status >= 0) status = 0; /* continue */
                     numSegs = 0;
                  }
               }
               else status = PI_BAD_I2C_WLEN;
            }
            else status = PI_BAD_I2C_WLEN;
            break;

         default:
            status = PI_BAD_I2C_CMD;
      }

      if (setesc) esc = 1; else esc = 0;

      setesc = 0;
   }

   if (status >= 0)
   {
      if (numSegs) status = i2cSegments(handle, segs, numSegs);
   }

   if (status >= 0) status = outPos;

   return status;
}